

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::FailureMessage::simple_abi_cxx11_(App *app,Error *e)

{
  bool bVar1;
  char *__s;
  Option *pOVar2;
  long *in_RDX;
  App *in_RSI;
  string *in_RDI;
  string *in_stack_00000050;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000058;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string *header;
  bool in_stack_000001c6;
  bool in_stack_000001c7;
  Option *in_stack_000001c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  Option *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_131 [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_41;
  byte local_19;
  App *local_10;
  
  local_19 = 0;
  local_10 = in_RSI;
  __s = (char *)(**(code **)(*in_RDX + 0x10))();
  this = &local_41;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(this,__s,(allocator<char> *)in_RDI);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffe80);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x388b47);
  pOVar2 = App::get_help_ptr(local_10);
  if (pOVar2 != (Option *)0x0) {
    App::get_help_ptr(local_10);
    Option::get_name_abi_cxx11_(in_stack_000001c8,in_stack_000001c7,in_stack_000001c6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe80,(value_type *)in_stack_fffffffffffffe78);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe80);
  }
  pOVar2 = App::get_help_all_ptr(local_10);
  if (pOVar2 != (Option *)0x0) {
    in_stack_fffffffffffffe88 = App::get_help_all_ptr(local_10);
    Option::get_name_abi_cxx11_(in_stack_000001c8,in_stack_000001c7,in_stack_000001c6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe80,(value_type *)in_stack_fffffffffffffe78);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe80);
  }
  bVar1 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pOVar2);
  if (!bVar1) {
    in_stack_fffffffffffffe80 = local_131;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>(this,__s,(allocator<char> *)in_RDI);
    CLI::detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_00000058,in_stack_00000050);
    ::std::operator+((char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe80);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe80);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe80);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe80);
    ::std::allocator<char>::~allocator((allocator<char> *)local_131);
  }
  local_19 = 1;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)pOVar2);
  if ((local_19 & 1) == 0) {
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe80);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string simple(const App *app, const Error &e) {
    std::string header = std::string(e.what()) + "\n";
    std::vector<std::string> names;

    // Collect names
    if(app->get_help_ptr() != nullptr)
        names.push_back(app->get_help_ptr()->get_name());

    if(app->get_help_all_ptr() != nullptr)
        names.push_back(app->get_help_all_ptr()->get_name());

    // If any names found, suggest those
    if(!names.empty())
        header += "Run with " + detail::join(names, " or ") + " for more information.\n";

    return header;
}